

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::UBOToSSBOInvertCase::iterate(UBOToSSBOInvertCase *this)

{
  allocator<unsigned_int> *this_00;
  value_type vVar1;
  int iVar2;
  code *pcVar3;
  deUint64 dVar4;
  bool bVar5;
  ContextType type;
  GLSLVersion version;
  int iVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  uint uVar9;
  deBool dVar10;
  RenderContext *pRVar11;
  char *pcVar12;
  ostream *poVar13;
  int *piVar14;
  undefined4 extraout_var;
  ProgramSources *sources;
  size_type sVar15;
  reference pvVar16;
  TestLog *pTVar17;
  TestError *pTVar18;
  MessageBuilder *pMVar19;
  void *pvVar20;
  string local_748;
  allocator<char> local_721;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  uint local_6bc;
  uint local_6b8;
  deUint32 ref;
  deUint32 res;
  deUint32 ndx_2;
  BufferMemMap bufMap_1;
  InterfaceVariableInfo valueInfo_1;
  deUint32 valueIndex_1;
  int blockSize_1;
  deUint32 blockIndex_2;
  int blockSize;
  deUint32 blockIndex_1;
  deUint32 ndx_1;
  BufferMemMap bufMap;
  InterfaceVariableInfo valueInfo;
  undefined1 local_5c0 [4];
  deUint32 valueIndex;
  InterfaceBlockInfo blockInfo;
  undefined1 local_570 [4];
  deUint32 blockIndex;
  int local_3f0;
  undefined1 local_3ec [4];
  int ndx;
  Random rnd;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputValues;
  Buffer outputBuffer;
  Buffer inputBuffer;
  ShaderSource local_370;
  ProgramSources local_348;
  undefined1 local_278 [8];
  ShaderProgram program;
  Functions *gl;
  ostringstream local_190 [8];
  ostringstream src;
  GLSLVersion glslVersion;
  UBOToSSBOInvertCase *this_local;
  
  pRVar11 = Context::getRenderContext((this->super_TestCase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar11->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar12 = glu::getGLSLVersionDeclaration(version);
  poVar13 = std::operator<<((ostream *)local_190,pcVar12);
  poVar13 = std::operator<<(poVar13,"\n");
  poVar13 = std::operator<<(poVar13,"layout (local_size_x = ");
  piVar14 = tcu::Vector<int,_3>::operator[](&this->m_localSize,0);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,*piVar14);
  poVar13 = std::operator<<(poVar13,", local_size_y = ");
  piVar14 = tcu::Vector<int,_3>::operator[](&this->m_localSize,1);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,*piVar14);
  poVar13 = std::operator<<(poVar13,", local_size_z = ");
  piVar14 = tcu::Vector<int,_3>::operator[](&this->m_localSize,2);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,*piVar14);
  poVar13 = std::operator<<(poVar13,") in;\n");
  poVar13 = std::operator<<(poVar13,"uniform Input {\n");
  poVar13 = std::operator<<(poVar13,"    uint values[");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->m_numValues);
  poVar13 = std::operator<<(poVar13,"];\n");
  poVar13 = std::operator<<(poVar13,"} ub_in;\n");
  poVar13 = std::operator<<(poVar13,"layout(binding = 1) buffer Output {\n");
  poVar13 = std::operator<<(poVar13,"    uint values[");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->m_numValues);
  poVar13 = std::operator<<(poVar13,"];\n");
  poVar13 = std::operator<<(poVar13,"} sb_out;\n");
  poVar13 = std::operator<<(poVar13,"void main (void) {\n");
  poVar13 = std::operator<<(poVar13,
                            "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n");
  poVar13 = std::operator<<(poVar13,
                            "    uint numValuesPerInv = uint(ub_in.values.length()) / (size.x*size.y*size.z);\n"
                           );
  poVar13 = std::operator<<(poVar13,
                            "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                           );
  poVar13 = std::operator<<(poVar13,"    uint offset          = numValuesPerInv*groupNdx;\n");
  poVar13 = std::operator<<(poVar13,"\n");
  poVar13 = std::operator<<(poVar13,"    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
  poVar13 = std::operator<<(poVar13,
                            "        sb_out.values[offset + ndx] = ~ub_in.values[offset + ndx];\n");
  std::operator<<(poVar13,"}\n");
  pRVar11 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*pRVar11->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar6);
  pRVar11 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_348);
  std::__cxx11::ostringstream::str();
  glu::ShaderSource::ShaderSource
            (&local_370,SHADERTYPE_COMPUTE,(string *)&inputBuffer.super_ObjectWrapper.m_object);
  sources = glu::ProgramSources::operator<<(&local_348,&local_370);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_278,pRVar11,sources);
  glu::ShaderSource::~ShaderSource(&local_370);
  std::__cxx11::string::~string((string *)&inputBuffer.super_ObjectWrapper.m_object);
  glu::ProgramSources::~ProgramSources(&local_348);
  pRVar11 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&outputBuffer.super_ObjectWrapper.m_object,
             pRVar11);
  pRVar11 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)
             &inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pRVar11);
  iVar6 = this->m_numValues;
  this_00 = (allocator<unsigned_int> *)((long)&rnd.m_rnd.z + 3);
  std::allocator<unsigned_int>::allocator(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rnd.m_rnd.w,(long)iVar6,this_00
            );
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&rnd.m_rnd.z + 3));
  de::Random::Random((Random *)local_3ec,0x111223f);
  local_3f0 = 0;
  while( true ) {
    iVar6 = local_3f0;
    sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rnd.m_rnd.w);
    if ((int)sVar15 <= iVar6) break;
    dVar7 = de::Random::getUint32((Random *)local_3ec);
    pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rnd.m_rnd.w,
                         (long)local_3f0);
    *pvVar16 = dVar7;
    local_3f0 = local_3f0 + 1;
  }
  de::Random::~Random((Random *)local_3ec);
  pTVar17 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  glu::operator<<(pTVar17,(ShaderProgram *)local_278);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_278);
  if (!bVar5) {
    pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar18,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0xa8);
    __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar17 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_570,pTVar17,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar19 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_570,(char (*) [14])"Work groups: ");
  pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,&this->m_workSize);
  tcu::MessageBuilder::operator<<(pMVar19,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_570);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1680);
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_278);
  (*pcVar3)(dVar7);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9a8);
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_278);
  blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (*pcVar3)(dVar7,0x92e2,"Input");
  dVar4 = program.m_program.m_info.linkTimeUs;
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_278);
  glu::getProgramInterfaceBlockInfo
            ((InterfaceBlockInfo *)local_5c0,(Functions *)dVar4,dVar7,0x92e2,
             blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9a8);
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_278);
  dVar7 = (*pcVar3)(dVar7,0x92e1,"Input.values");
  dVar4 = program.m_program.m_info.linkTimeUs;
  dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_278);
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&bufMap.m_ptr,(Functions *)dVar4,dVar8,0x92e1,dVar7);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x40);
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)&outputBuffer.super_ObjectWrapper.m_object)
  ;
  (*pcVar3)(0x8a11,dVar7);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x150))(0x8a11,blockInfo.index,0);
  BufferMemMap::BufferMemMap
            ((BufferMemMap *)&blockIndex_1,(Functions *)program.m_program.m_info.linkTimeUs,0x8a11,0
             ,blockInfo.index,2);
  blockSize = 0;
  while( true ) {
    sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rnd.m_rnd.w);
    uVar9 = de::min<unsigned_int>(valueInfo.atomicCounterBufferIndex,(uint)sVar15);
    if (uVar9 <= (uint)blockSize) break;
    pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rnd.m_rnd.w,
                         (ulong)(uint)blockSize);
    vVar1 = *pvVar16;
    pvVar20 = BufferMemMap::getPtr((BufferMemMap *)&blockIndex_1);
    *(value_type *)
     ((long)pvVar20 + (ulong)(blockSize * valueInfo.arraySize) + (ulong)valueInfo.type) = vVar1;
    blockSize = blockSize + 1;
  }
  BufferMemMap::~BufferMemMap((BufferMemMap *)&blockIndex_1);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x15d0);
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_278);
  (*pcVar3)(dVar7,blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,0);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x48);
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)&outputBuffer.super_ObjectWrapper.m_object)
  ;
  (*pcVar3)(0x8a11,0,dVar7);
  dVar7 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
  glu::checkError(dVar7,"Input buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0xc1);
  glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)&bufMap.m_ptr);
  glu::InterfaceBlockInfo::~InterfaceBlockInfo((InterfaceBlockInfo *)local_5c0);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9a8);
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_278);
  dVar7 = (*pcVar3)(dVar7,0x92e6,"Output");
  dVar4 = program.m_program.m_info.linkTimeUs;
  dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_278);
  iVar6 = glu::getProgramResourceInt((Functions *)dVar4,dVar8,0x92e6,dVar7,0x9303);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x40);
  dVar7 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)
                     &inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  (*pcVar3)(0x90d2,dVar7);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x150))(0x90d2,(long)iVar6,0,0x88e1);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x48);
  dVar7 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)
                     &inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  (*pcVar3)(0x90d2,1,dVar7);
  dVar7 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
  glu::checkError(dVar7,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0xcc);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x528);
  piVar14 = tcu::Vector<int,_3>::operator[](&this->m_workSize,0);
  iVar6 = *piVar14;
  piVar14 = tcu::Vector<int,_3>::operator[](&this->m_workSize,1);
  iVar2 = *piVar14;
  piVar14 = tcu::Vector<int,_3>::operator[](&this->m_workSize,2);
  (*pcVar3)(iVar6,iVar2,*piVar14);
  dVar7 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
  glu::checkError(dVar7,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0xd1);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9a8);
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_278);
  dVar7 = (*pcVar3)(dVar7,0x92e6,"Output");
  dVar4 = program.m_program.m_info.linkTimeUs;
  dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_278);
  iVar6 = glu::getProgramResourceInt((Functions *)dVar4,dVar8,0x92e6,dVar7,0x9303);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9a8);
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_278);
  dVar7 = (*pcVar3)(dVar7,0x92e5,"Output.values");
  dVar4 = program.m_program.m_info.linkTimeUs;
  dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_278);
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&bufMap_1.m_ptr,(Functions *)dVar4,dVar8,0x92e5,dVar7);
  BufferMemMap::BufferMemMap
            ((BufferMemMap *)&res,(Functions *)program.m_program.m_info.linkTimeUs,0x90d2,0,iVar6,1)
  ;
  while( true ) {
    dVar10 = ::deGetFalse();
    if (dVar10 != 0) break;
    sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rnd.m_rnd.w);
    if (valueInfo_1.atomicCounterBufferIndex != (deUint32)sVar15) break;
    dVar10 = ::deGetFalse();
    if (dVar10 == 0) {
      ref = 0;
      while( true ) {
        if (valueInfo_1.atomicCounterBufferIndex <= ref) {
          BufferMemMap::~BufferMemMap((BufferMemMap *)&res);
          glu::InterfaceVariableInfo::~InterfaceVariableInfo
                    ((InterfaceVariableInfo *)&bufMap_1.m_ptr);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rnd.m_rnd.w);
          glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                    ((TypedObjectWrapper<(glu::ObjectType)1> *)
                     &inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                    ((TypedObjectWrapper<(glu::ObjectType)1> *)
                     &outputBuffer.super_ObjectWrapper.m_object);
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_278);
          std::__cxx11::ostringstream::~ostringstream(local_190);
          return STOP;
        }
        pvVar20 = BufferMemMap::getPtr((BufferMemMap *)&res);
        local_6b8 = *(uint *)((long)pvVar20 +
                             (ulong)(valueInfo_1.arraySize * ref) + (ulong)valueInfo_1.type);
        pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rnd.m_rnd.w,
                             (ulong)ref);
        local_6bc = *pvVar16 ^ 0xffffffff;
        if (local_6b8 != local_6bc) break;
        ref = ref + 1;
      }
      pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_720,"Comparison failed for Output.values[",&local_721);
      de::toString<unsigned_int>(&local_748,&ref);
      std::operator+(&local_700,&local_720,&local_748);
      std::operator+(&local_6e0,&local_700,"]");
      tcu::TestError::TestError(pTVar18,&local_6e0);
      __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar18,(char *)0x0,"valueInfo.arraySize == (deUint32)inputValues.size()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0xdb);
  __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion	glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream	src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "uniform Input {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} ub_in;\n"
			<< "layout(binding = 1) buffer Output {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_out;\n"
			<< "void main (void) {\n"
			<< "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n"
			<< "    uint numValuesPerInv = uint(ub_in.values.length()) / (size.x*size.y*size.z);\n"
			<< "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
			<< "    uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "        sb_out.values[offset + ndx] = ~ub_in.values[offset + ndx];\n"
			<< "}\n";

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));
		const Buffer				inputBuffer		(m_context.getRenderContext());
		const Buffer				outputBuffer	(m_context.getRenderContext());
		std::vector<deUint32>		inputValues		(m_numValues);

		// Compute input values.
		{
			de::Random rnd(0x111223f);
			for (int ndx = 0; ndx < (int)inputValues.size(); ndx++)
				inputValues[ndx] = rnd.getUint32();
		}

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Input buffer setup
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM_BLOCK, "Input");
			const InterfaceBlockInfo	blockInfo	= getProgramInterfaceBlockInfo(gl, program.getProgram(), GL_UNIFORM_BLOCK, blockIndex);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "Input.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_UNIFORM, valueIndex);

			gl.bindBuffer(GL_UNIFORM_BUFFER, *inputBuffer);
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)blockInfo.dataSize, DE_NULL, GL_STATIC_DRAW);

			{
				const BufferMemMap bufMap(gl, GL_UNIFORM_BUFFER, 0, (int)blockInfo.dataSize, GL_MAP_WRITE_BIT);

				for (deUint32 ndx = 0; ndx < de::min(valueInfo.arraySize, (deUint32)inputValues.size()); ndx++)
					*(deUint32*)((deUint8*)bufMap.getPtr() + valueInfo.offset + ndx*valueInfo.arrayStride) = inputValues[ndx];
			}

			gl.uniformBlockBinding(program.getProgram(), blockIndex, 0);
			gl.bindBufferBase(GL_UNIFORM_BUFFER, 0, *inputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Input buffer setup failed");
		}

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			TCU_CHECK(valueInfo.arraySize == (deUint32)inputValues.size());
			for (deUint32 ndx = 0; ndx < valueInfo.arraySize; ndx++)
			{
				const deUint32	res		= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*ndx));
				const deUint32	ref		= ~inputValues[ndx];

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for Output.values[") + de::toString(ndx) + "]");
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}